

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

bool __thiscall Syntax::Parser::parse(Parser *this,string *LHS,bool isOnPanicMode)

{
  string *LHS_00;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Rule *this_00;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *pvVar4;
  pointer pbVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pointer __x;
  pointer pbVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rulesToProcess;
  string value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  string *local_88;
  Rule *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  if (this->currentToken == (Token *)0x0) {
    return true;
  }
  bVar1 = Language::Rule::isTerminal(LHS);
  if (bVar1) {
    bVar1 = shouldTakeNext(this,LHS);
    if (bVar1) {
      bVar1 = isKeyword(LHS);
      if (bVar1) {
        Token::getValue_abi_cxx11_(&local_70,this->currentToken);
        AST::ASTBuilder::push(this->AST_Builder,&local_70,this->currentToken);
        std::__cxx11::string::~string((string *)&local_70);
      }
      next(this);
      return true;
    }
  }
  else {
    this_00 = Language::Grammar::getRule(this->grammar,LHS);
    bVar1 = Language::Rule::doesBelongToFirst(this_00,this->currentToken);
    if (bVar1) {
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_a8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_88 = LHS;
      local_80 = this_00;
      pvVar4 = Language::Rule::getRHS_abi_cxx11_(this_00);
      __x = (pvVar4->
            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
      local_78 = (pvVar4->
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      bVar1 = false;
      do {
        LHS_00 = local_88;
        pbVar6 = local_a8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if ((__x == local_78) || (bVar1)) {
          for (pbVar5 = local_a8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar5 != pbVar6;
              pbVar5 = pbVar5 + 1) {
            if (*(pbVar5->_M_dataplus)._M_p == '@') {
              AST::ASTBuilder::handle(this->AST_Builder,pbVar5,LHS_00);
            }
            else {
              std::__cxx11::string::string((string *)&local_50,(string *)pbVar5);
              bVar1 = parse(this,&local_50,false);
              std::__cxx11::string::~string((string *)&local_50);
              if (!bVar1) {
                this->AST_Builder->isIgnoreModeOn = true;
                printError(this,local_80);
                panic(this,pbVar5);
              }
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
          return true;
        }
        pbVar6 = (__x->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pbVar5 = (__x->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        bVar1 = false;
        do {
          if (pbVar6 == pbVar5) break;
          std::__cxx11::string::string((string *)&local_70,(string *)pbVar6);
          bVar2 = std::operator!=(&local_70,"#");
          bVar3 = true;
          if ((bVar2) && (*local_70._M_dataplus._M_p != '@')) {
            bVar3 = Language::Grammar::shouldTake(this->grammar,&local_70,this->currentToken);
            if (bVar3) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=(&local_a8,__x);
              bVar1 = true;
            }
            bVar3 = false;
          }
          std::__cxx11::string::~string((string *)&local_70);
          pbVar6 = pbVar6 + 1;
        } while (bVar3);
        __x = __x + 1;
      } while( true );
    }
    if (((isOnPanicMode) || (bVar1 = Language::Rule::isNullable(this_00), bVar1)) &&
       (bVar1 = Language::Rule::doesBelongToFollow(this_00,this->currentToken), bVar1)) {
      AST::ASTBuilder::push(this->AST_Builder,LHS,(Token *)0x0);
      return true;
    }
  }
  return false;
}

Assistant:

bool Syntax::Parser::parse(std::string LHS, bool isOnPanicMode) {
    if (currentToken == nullptr && isOnPanicMode) return true;
    if (currentToken == nullptr) return true;

    if (Language::Rule::isTerminal(LHS)) {
        if (shouldTakeNext(LHS)) {
            if (isKeyword(LHS)) {
                std::string value = currentToken->getValue();
                AST_Builder->push(value, currentToken);
            }
            next();
            return true;
        } else return false;
    }

    const Language::Rule *currentRule = grammar->getRule(LHS);
    if (!currentRule->doesBelongToFirst(currentToken)) {
        if ((isOnPanicMode || currentRule->isNullable()) && currentRule->doesBelongToFollow(currentToken)) {
            AST_Builder->push(LHS, nullptr);
            return true;
        } else return false;
    }

    std::vector<std::string> rulesToProcess;
    bool found = false;
    for (auto &production : currentRule->getRHS()) {
        if (found) break;
        for (auto _rule: production) {
            if (_rule != "#" && _rule.front() != '@') {
                if (grammar->shouldTake(_rule, currentToken)) {
                    rulesToProcess = production;
                    found = true;
                    break;
                } else break;
            }
        }
    }

    for (auto &rule: rulesToProcess) {
        if (rule.front() == '@') { // do action
            AST_Builder->handle(rule, LHS);
            continue;
        } else {
            bool result = parse(rule);
            if (!result) {
                AST_Builder->isIgnoreModeOn = true;
                printError(*currentRule);
                panic(rule);
            }
        }
    }

    return true;
}